

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

Image * __thiscall FFT::ComplexData::get(ComplexData *this)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  uchar *puVar7;
  uint uVar8;
  BaseComplexData<kiss_fft_cpx> *in_RSI;
  Image *in_RDI;
  undefined1 in_ZMM1 [64];
  uint32_t outX;
  uint32_t inX;
  uint32_t outY;
  uint32_t inY;
  uint32_t middleY;
  uint32_t middleX;
  uint32_t size;
  uint8_t *out;
  Image *image;
  int local_70;
  undefined4 in_stack_ffffffffffffff94;
  undefined2 uVar9;
  uint8_t colorCount_;
  undefined8 in_stack_ffffffffffffff98;
  uint32_t uVar10;
  Image *this_00;
  uint local_44;
  uint local_3c;
  
  uVar9 = (undefined2)((uint)in_stack_ffffffffffffff94 >> 0x10);
  this_00 = in_RDI;
  bVar5 = BaseComplexData<kiss_fft_cpx>::empty(in_RSI);
  colorCount_ = (uint8_t)((ushort)uVar9 >> 8);
  uVar10 = (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (bVar5) {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (this_00,uVar10,(uint32_t)in_stack_ffffffffffffff98,colorCount_,(uint8_t)uVar9);
  }
  else {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (this_00,uVar10,(uint32_t)in_stack_ffffffffffffff98,colorCount_,(uint8_t)uVar9);
    puVar7 = PenguinV_Image::ImageTemplate<unsigned_char>::data(this_00);
    uVar10 = in_RSI->_width;
    uVar1 = in_RSI->_height;
    uVar8 = in_RSI->_width >> 1;
    uVar6 = in_RSI->_height >> 1;
    for (local_3c = 0; local_3c < in_RSI->_height; local_3c = local_3c + 1) {
      uVar3 = uVar6;
      if (uVar6 <= local_3c) {
        uVar3 = -uVar6;
      }
      for (local_44 = 0; local_44 < in_RSI->_width; local_44 = local_44 + 1) {
        uVar4 = uVar8;
        if (uVar8 <= local_44) {
          uVar4 = -uVar8;
        }
        local_70 = uVar4 + local_44;
        auVar2 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,uVar10 * uVar1);
        in_ZMM1 = ZEXT1664(ZEXT816(0x3fe0000000000000));
        puVar7[(uVar3 + local_3c) * in_RSI->_width + local_70] =
             (uchar)(int)(in_RSI->_data[local_3c * in_RSI->_width + local_44].r / auVar2._0_4_ + 0.5
                         );
      }
    }
  }
  return in_RDI;
}

Assistant:

PenguinV_Image::Image ComplexData::get() const
    {
        if ( empty() )
            return PenguinV_Image::Image();

        PenguinV_Image::Image image( _width, _height, 1u, 1u );
        uint8_t * out = image.data();

        const uint32_t size = _width * _height;
        const uint32_t middleX = _width  / 2;
        const uint32_t middleY = _height / 2;

        for ( uint32_t inY = 0; inY < _height; ++inY ) {
            const uint32_t outY = (inY < middleY) ? middleY + inY : inY - middleY;

            for ( uint32_t inX = 0; inX < _width; ++inX ) {
                const uint32_t outX = (inX < middleX) ? middleX + inX : inX - middleX;
                out[outY * _width + outX] = static_cast<uint8_t>(_data[inY * _width + inX].r / static_cast<float>(size) + 0.5);
            }
        }

        return image;
    }